

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O3

guint64 p2sc_cuc2ticks(guint8 *t,int passno)

{
  uint uVar1;
  guint64 gVar2;
  
  if (t != (guint8 *)0x0) {
    uVar1 = *(uint *)t;
    gVar2 = p2sc_cuc2ticks_decoded
                      (passno,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18,(uint)t[6] | (uint)t[5] << 8 | (uint)t[4] << 0x10);
    return gVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

guint64 p2sc_cuc2ticks(const guint8 t[SIZEOF_CUC], int passno) {
    if (!t)
        return -1;

    guint32 f = (t[4] << 16) + (t[5] << 8) + t[6];

    guint32 s;
    memcpy(&s, t, sizeof s);
    s = GUINT32_FROM_BE(s);

    return p2sc_cuc2ticks_decoded(passno, s, f);
}